

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_manager.cpp
# Opt level: O2

void __thiscall
jessilib::io::command_manager::unregister_command(command_manager *this,basic_command *in_command)

{
  basic_command *local_20;
  
  std::__shared_mutex_pthread::lock(&(this->m_commands_mutex)._M_impl);
  local_20 = in_command;
  std::
  erase<jessilib::io::basic_command*,std::allocator<jessilib::io::basic_command*>,jessilib::io::basic_command*>
            (&this->m_commands,&local_20);
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_commands_mutex);
  return;
}

Assistant:

void command_manager::unregister_command(basic_command& in_command) {
	std::lock_guard<std::shared_mutex> guard{ m_commands_mutex };
	std::erase(m_commands, &in_command);
}